

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::TimeZoneFormat::parseZoneID
          (TimeZoneFormat *this,UnicodeString *text,ParsePosition *pos,UnicodeString *tzID)

{
  int32_t start;
  int iVar1;
  TextTrieMapSearchResultHandler *handler;
  code *size;
  UErrorCode status;
  
  status = U_ZERO_ERROR;
  size = initZoneIdTrie;
  umtx_initOnce((UInitOnce *)&gZoneIdTrieInitOnce,initZoneIdTrie,&status);
  start = pos->index;
  UnicodeString::setToBogus(tzID);
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    handler = (TextTrieMapSearchResultHandler *)UMemory::operator_new((UMemory *)0x18,(size_t)size);
    if (handler != (TextTrieMapSearchResultHandler *)0x0) {
      handler->_vptr_TextTrieMapSearchResultHandler = (_func_int **)&PTR_handleMatch_00398eb8;
      *(undefined4 *)&handler[1]._vptr_TextTrieMapSearchResultHandler = 0;
      handler[2]._vptr_TextTrieMapSearchResultHandler = (_func_int **)0x0;
    }
    TextTrieMap::search(gZoneIdTrie,text,start,handler,&status);
    iVar1 = *(int *)&handler[1]._vptr_TextTrieMapSearchResultHandler;
    if (iVar1 < 1) {
      (*handler->_vptr_TextTrieMapSearchResultHandler[2])(handler);
    }
    else {
      UnicodeString::setTo(tzID,(char16_t *)handler[2]._vptr_TextTrieMapSearchResultHandler,-1);
      (*handler->_vptr_TextTrieMapSearchResultHandler[2])(handler);
      if (0 < iVar1) {
        pos->index = iVar1 + start;
        return tzID;
      }
    }
  }
  pos->errorIndex = start;
  return tzID;
}

Assistant:

UnicodeString&
TimeZoneFormat::parseZoneID(const UnicodeString& text, ParsePosition& pos, UnicodeString& tzID) const {
    UErrorCode status = U_ZERO_ERROR;
    umtx_initOnce(gZoneIdTrieInitOnce, &initZoneIdTrie, status);

    int32_t start = pos.getIndex();
    int32_t len = 0;
    tzID.setToBogus();

    if (U_SUCCESS(status)) {
        LocalPointer<ZoneIdMatchHandler> handler(new ZoneIdMatchHandler());
        gZoneIdTrie->search(text, start, handler.getAlias(), status); 
        len = handler->getMatchLen();
        if (len > 0) {
            tzID.setTo(handler->getID(), -1);
        }
    }

    if (len > 0) {
        pos.setIndex(start + len);
    } else {
        pos.setErrorIndex(start);
    }

    return tzID;
}